

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O1

void __thiscall
TCLAP::CmdLine::parse
          (CmdLine *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *plVar2;
  pointer pbVar3;
  ulong uVar4;
  pointer pcVar5;
  bool bVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  CmdLineParseException *pCVar11;
  _List_node_base *p_Var12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  string local_70;
  string local_50;
  
  std::__cxx11::string::_M_assign((string *)&this->_progName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(args,(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  local_70._M_dataplus._M_p = (pointer)((ulong)local_70._M_dataplus._M_p._4_4_ << 0x20);
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    iVar14 = 0;
  }
  else {
    plVar2 = &this->_argList;
    iVar14 = 0;
    p_Var12 = (_List_node_base *)plVar2;
LAB_0011853a:
    do {
      p_Var12 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)&p_Var12->_M_next)->
                _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var12 == (_List_node_base *)plVar2) {
        bVar6 = false;
      }
      else {
        cVar8 = (**(code **)(*(long *)p_Var12[1]._M_next + 0x18))(p_Var12[1]._M_next,&local_70,args)
        ;
        if (cVar8 == '\0') goto LAB_0011853a;
        iVar9 = XorHandler::check(&this->_xorHandler,(Arg *)p_Var12[1]._M_next);
        iVar14 = iVar14 + iVar9;
        bVar6 = true;
      }
      if (!bVar6) {
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = pbVar3 + (int)(uint)local_70._M_dataplus._M_p;
        uVar4 = pbVar3[(int)(uint)local_70._M_dataplus._M_p]._M_string_length;
        if ((uVar4 == 0) || (*(pbVar1->_M_dataplus)._M_p == '-')) {
          bVar15 = uVar4 < 2;
          if (!bVar15) {
            pcVar5 = (pbVar1->_M_dataplus)._M_p;
            if (pcVar5[1] != '\a') goto LAB_001185c3;
            uVar7 = 2;
            do {
              uVar13 = uVar7;
              if (uVar4 == uVar13) break;
              uVar7 = uVar13 + 1;
            } while (pcVar5[uVar13] == '\a');
            bVar15 = uVar4 <= uVar13;
          }
        }
        else {
LAB_001185c3:
          bVar15 = false;
        }
        if (bVar15) {
          bVar6 = true;
        }
      }
      if ((!bVar6) && (Arg::ignoreRestRef()::ign == '\0')) {
        pCVar11 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Couldn\'t find match for argument","");
        CmdLineParseException::CmdLineParseException
                  (pCVar11,&local_50,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (int)(uint)local_70._M_dataplus._M_p
                  );
        __cxa_throw(pCVar11,&CmdLineParseException::typeinfo,ArgException::~ArgException);
      }
      uVar10 = (uint)local_70._M_dataplus._M_p + 1;
      local_70._M_dataplus._M_p._0_4_ = uVar10;
      p_Var12 = (_List_node_base *)plVar2;
    } while ((ulong)uVar10 <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (iVar14 < this->_numRequired) {
    missingArgsException(this);
  }
  if (iVar14 <= this->_numRequired) {
    return;
  }
  pCVar11 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Too many arguments!","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"undefined","");
  CmdLineParseException::CmdLineParseException(pCVar11,&local_50,&local_70);
  __cxa_throw(pCVar11,&CmdLineParseException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline void CmdLine::parse(std::vector<std::string>& args)
{
	bool shouldExit = false;
	int estat = 0;

	try {
		_progName = args.front();
		args.erase(args.begin());

		int requiredCount = 0;

		for (int i = 0; static_cast<unsigned int>(i) < args.size(); i++) 
		{
			bool matched = false;
			for (ArgListIterator it = _argList.begin();
			     it != _argList.end(); it++) {
				if ( (*it)->processArg( &i, args ) )
				{
					requiredCount += _xorHandler.check( *it );
					matched = true;
					break;
				}
			}

			// checks to see if the argument is an empty combined
			// switch and if so, then we've actually matched it
			if ( !matched && _emptyCombined( args[i] ) )
				matched = true;

			if ( !matched && !Arg::ignoreRest() )
				throw(CmdLineParseException("Couldn't find match "
				                            "for argument",
				                            args[i]));
		}

		if ( requiredCount < _numRequired )
			missingArgsException();

		if ( requiredCount > _numRequired )
			throw(CmdLineParseException("Too many arguments!"));

	} catch ( ArgException& e ) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		try {
			_output->failure(*this,e);
		} catch ( ExitException &ee ) {
			estat = ee.getExitStatus();
			shouldExit = true;
		}
	} catch (ExitException &ee) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		estat = ee.getExitStatus();
		shouldExit = true;
	}

	if (shouldExit)
		exit(estat);
}